

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::SomeObjectHelper<unsigned_int>
              (RecyclableObject *obj,uint length,uint start,RecyclableObject *callBackFn,Var thisArg
              ,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *this;
  BOOL BVar2;
  Var pvVar3;
  JavascriptMethod p_Var4;
  Var pvVar5;
  long lVar6;
  undefined1 local_70 [8];
  JsReentLock jsReentLock;
  
  local_70 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_70)->noJsReentrancy;
  ((ThreadContext *)local_70)->noJsReentrancy = true;
  jsReentLock._28_4_ = length;
  JsReentLock::setObjectForMutation((JsReentLock *)local_70,obj);
  do {
    if ((uint)jsReentLock._28_4_ <= start) {
      lVar6 = 0x3f0;
LAB_00a7196b:
      pvVar3 = *(Var *)((long)&(((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                               super_JavascriptLibraryBase).super_FinalizableObject.
                               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar6);
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return pvVar3;
    }
    *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    BVar2 = JavascriptOperators::HasItem(obj,start);
    JsReentLock::MutateArrayObject((JsReentLock *)local_70);
    *(bool *)((long)local_70 + 0x108) = true;
    if (BVar2 != 0) {
      *(undefined1 *)((long)local_70 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar3 = JavascriptOperators::GetItem(obj,start,scriptContext);
      this = scriptContext->threadContext;
      bVar1 = this->reentrancySafeOrHandled;
      this->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
      ThreadContext::AssertJsReentrancy(scriptContext->threadContext);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var4);
      p_Var4 = RecyclableObject::GetEntryPoint(callBackFn);
      pvVar5 = JavascriptNumber::ToVar(start,scriptContext);
      pvVar3 = (*p_Var4)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,thisArg,pvVar3,
                         pvVar5,obj);
      this->reentrancySafeOrHandled = bVar1;
      BVar2 = JavascriptConversion::ToBoolean(pvVar3,scriptContext);
      if (BVar2 != 0) {
        lVar6 = 1000;
        goto LAB_00a7196b;
      }
    }
    start = start + 1;
  } while( true );
}

Assistant:

Var JavascriptArray::SomeObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var thisArg, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        Var testResult = nullptr;

        for (T k = start; k < length; k++)
        {
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, k));
            if (hasItem)
            {
                JS_REENTRANT_UNLOCK(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, k, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }

        return scriptContext->GetLibrary()->GetFalse();
    }